

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O1

mat4_t * mat4_ortho4(mat4_t *__return_storage_ptr__,float left,float right,float bottom,float top,
                    float near,float far)

{
  __return_storage_ptr__->m[0][0] = 2.0 / (right - left);
  *(float *)((long)__return_storage_ptr__ + 4) = 0.0;
  *(float *)((long)__return_storage_ptr__ + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[0] + 3) = 0;
  __return_storage_ptr__->m[1][1] = 2.0 / (top - bottom);
  ((float *)((long)__return_storage_ptr__ + 0x10))[2] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x10))[3] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[0] = 0.0;
  ((float *)((long)__return_storage_ptr__ + 0x20))[1] = 0.0;
  __return_storage_ptr__->m[2][2] = -2.0 / (far - near);
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = -(left + right) / (right - left);
  __return_storage_ptr__->m[3][1] = -(bottom + top) / (top - bottom);
  __return_storage_ptr__->m[3][2] = -(near + far) / (far - near);
  __return_storage_ptr__->m[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho4(float left, float right, float bottom, float top, float near, float far) {
    float	width	= right - left;
    float	height	= top - bottom;
    float	depth	= far - near;
    float	r00	= 2.0f / width;
    float	r11	= 2.0f / height;
    float	r22	= -2.0f / depth;
    float	r03	= -(right + left) / width;
    float	r13	= -(top + bottom) / height;
    float	r23	= -(far + near) / depth;
    return mat4(r00, 0.0f, 0.0f, 0.0f,
            0.0f, r11, 0.0f, 0.0f,
            0.0f, 0.0f, r22, 0.0f,
            r03, r13, r23, 1.0f);
}